

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_extra_drop_info.cpp
# Opt level: O1

unique_ptr<duckdb::ExtraDropInfo,_std::default_delete<duckdb::ExtraDropInfo>,_true> __thiscall
duckdb::ExtraDropSecretInfo::Deserialize(ExtraDropSecretInfo *this,Deserializer *deserializer)

{
  SecretPersistType SVar1;
  int iVar2;
  uint uVar3;
  ExtraDropSecretInfo *this_00;
  pointer pEVar4;
  pointer *__ptr;
  unique_ptr<duckdb::ExtraDropSecretInfo,_std::default_delete<duckdb::ExtraDropSecretInfo>,_true>
  result;
  string str;
  _Head_base<0UL,_duckdb::ExtraDropSecretInfo_*,_false> local_58;
  char *local_50;
  undefined8 local_48;
  char local_40 [16];
  
  this_00 = (ExtraDropSecretInfo *)operator_new(0x30);
  ExtraDropSecretInfo(this_00);
  local_58._M_head_impl = this_00;
  pEVar4 = unique_ptr<duckdb::ExtraDropSecretInfo,_std::default_delete<duckdb::ExtraDropSecretInfo>,_true>
           ::operator->((unique_ptr<duckdb::ExtraDropSecretInfo,_std::default_delete<duckdb::ExtraDropSecretInfo>,_true>
                         *)&local_58);
  (*deserializer->_vptr_Deserializer[2])(deserializer,200,"persist_mode");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    SVar1 = EnumUtil::FromString<duckdb::SecretPersistType>(local_50);
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
  }
  else {
    iVar2 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
    SVar1 = (SecretPersistType)iVar2;
  }
  (pEVar4->super_ExtraDropInfo).field_0x9 = SVar1;
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  pEVar4 = unique_ptr<duckdb::ExtraDropSecretInfo,_std::default_delete<duckdb::ExtraDropSecretInfo>,_true>
           ::operator->((unique_ptr<duckdb::ExtraDropSecretInfo,_std::default_delete<duckdb::ExtraDropSecretInfo>,_true>
                         *)&local_58);
  uVar3 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xc9,"secret_storage");
  if ((char)uVar3 == '\0') {
    local_48 = 0;
    local_40[0] = '\0';
    local_50 = local_40;
    ::std::__cxx11::string::operator=((string *)&pEVar4->secret_storage,(string *)&local_50);
    if (local_50 == local_40) goto LAB_005bf90a;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    ::std::__cxx11::string::operator=((string *)&pEVar4->secret_storage,(string *)&local_50);
    if (local_50 == local_40) goto LAB_005bf90a;
  }
  operator_delete(local_50);
LAB_005bf90a:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar3 & 0xff));
  (this->super_ExtraDropInfo)._vptr_ExtraDropInfo = (_func_int **)local_58._M_head_impl;
  return (unique_ptr<duckdb::ExtraDropInfo,_std::default_delete<duckdb::ExtraDropInfo>_>)
         (unique_ptr<duckdb::ExtraDropInfo,_std::default_delete<duckdb::ExtraDropInfo>_>)this;
}

Assistant:

unique_ptr<ExtraDropInfo> ExtraDropSecretInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<ExtraDropSecretInfo>(new ExtraDropSecretInfo());
	deserializer.ReadProperty<SecretPersistType>(200, "persist_mode", result->persist_mode);
	deserializer.ReadPropertyWithDefault<string>(201, "secret_storage", result->secret_storage);
	return std::move(result);
}